

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Gia_Man_t * Lf_ManDeriveMappingGia(Lf_Man_t *p)

{
  Jf_Par_t *pJVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  Vec_Mem_t *pVVar5;
  word wVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  Vec_Int_t *p_00;
  int *piVar12;
  Vec_Int_t *p_01;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  size_t sVar13;
  char *pcVar14;
  Gia_Obj_t *pGVar15;
  Lf_Cut_t *pLVar16;
  undefined4 extraout_var;
  ulong uVar17;
  ulong *puVar18;
  uint uVar19;
  ulong uVar20;
  word *pwVar21;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  word *pwVar26;
  uint uVar27;
  uint *puVar28;
  int iVar29;
  Gia_Man_t *pGVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  word *pLimit;
  ulong uVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int pVarsNew [13];
  word pTruthCof [128];
  undefined4 *local_530;
  uint local_50c;
  int local_4f0;
  uint local_4c8;
  uint local_4c4;
  undefined8 local_4c0;
  ulong local_4b8;
  word *local_4b0;
  ulong *local_4a8;
  ulong *local_4a0;
  long local_498;
  ulong local_490;
  ulong local_488;
  long local_480;
  int local_478 [16];
  word local_438 [129];
  
  uVar24 = p->pGia->nObjs;
  uVar32 = (ulong)(int)uVar24;
  uVar27 = uVar24;
  if (uVar24 - 1 < 0xf) {
    uVar27 = 0x10;
  }
  if ((uVar27 == 0) ||
     (local_530 = (undefined4 *)malloc((long)(int)uVar27 << 2), local_530 == (undefined4 *)0x0)) {
    local_530 = (undefined4 *)0x0;
  }
  else {
    memset(local_530,0xff,uVar32 * 4);
  }
  pJVar1 = p->pPars;
  iVar11 = (int)pJVar1->Area;
  iVar29 = (int)pJVar1->Edge;
  iVar31 = iVar29 + (iVar11 + uVar24) * 2;
  iVar10 = (int)pJVar1->Mux7;
  local_4f0 = iVar31 + iVar10 * 4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar22 = 0x10;
  if (0xe < (uint)(iVar31 + -1 + iVar10 * 4)) {
    iVar22 = local_4f0;
  }
  p_00->nCap = iVar22;
  if (iVar22 == 0) {
    p_00->pArray = (int *)0x0;
    p_00->nSize = local_4f0;
  }
  else {
    piVar12 = (int *)malloc((long)iVar22 << 2);
    p_00->pArray = piVar12;
    p_00->nSize = local_4f0;
    if (piVar12 != (int *)0x0) {
      memset(piVar12,0,(long)local_4f0 << 2);
      iVar11 = (int)pJVar1->Area;
      iVar29 = (int)pJVar1->Edge;
    }
  }
  iVar22 = iVar29 + iVar11 * 2 + 1000;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar29 + iVar11 * 2 + 999U) {
    iVar10 = iVar22;
  }
  p_01->nCap = iVar10;
  if (iVar10 == 0) {
    p_01->pArray = (int *)0x0;
    p_01->nSize = iVar22;
  }
  else {
    piVar12 = (int *)malloc((long)iVar10 << 2);
    p_01->pArray = piVar12;
    p_01->nSize = iVar22;
    if (piVar12 != (int *)0x0) {
      memset(piVar12,0,(long)iVar22 << 2);
    }
  }
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar12 = (int *)malloc(0x40000);
  vMemory->pArray = piVar12;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar12 = (int *)malloc(0x40);
  p_02->pArray = piVar12;
  if (pJVar1->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x744,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  p_03 = Gia_ManStart(uVar24);
  pGVar30 = p->pGia;
  pcVar2 = pGVar30->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar2);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar2);
  }
  p_03->pName = pcVar14;
  pcVar2 = pGVar30->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar2);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar2);
  }
  p_03->pSpec = pcVar14;
  if ((int)uVar24 < 1) {
LAB_0073a619:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *local_530 = 0;
  if (1 < pGVar30->nObjs) {
    uVar34 = 1;
    do {
      pGVar3 = pGVar30->pObjs;
      uVar4 = *(undefined8 *)(pGVar3 + uVar34);
      uVar27 = (uint)uVar4;
      if ((uVar27 & 0x9fffffff) == 0x9fffffff) {
        pGVar15 = Gia_ManAppendObj(p_03);
        uVar33 = *(ulong *)pGVar15;
        *(ulong *)pGVar15 = uVar33 | 0x9fffffff;
        *(ulong *)pGVar15 =
             uVar33 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_03->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_03->pObjs;
        if ((pGVar15 < pGVar3) || (pGVar3 + p_03->nObjs <= pGVar15)) {
LAB_0073a5fa:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_03->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_03->pObjs;
        if ((pGVar15 < pGVar3) || (pGVar3 + p_03->nObjs <= pGVar15)) goto LAB_0073a5fa;
        if (uVar32 <= uVar34) goto LAB_0073a619;
        local_530[uVar34] = (int)((ulong)((long)pGVar15 - (long)pGVar3) >> 2) * 0x55555556;
      }
      else {
        uVar19 = uVar27 & 0x1fffffff;
        iVar11 = (int)uVar34;
        if ((~uVar27 & 0x1fffffff) == 0 || -1 < (int)uVar27) {
          if ((((int)uVar27 < 0) || (uVar19 == 0x1fffffff)) ||
             (uVar19 != ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff))) {
            if ((long)(p->vOffsets).nSize <= (long)uVar34) {
LAB_0073a5bc:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar29 = (p->vOffsets).pArray[uVar34];
            if (((long)iVar29 < 0) || ((p->vMapRefs).nSize <= iVar29)) goto LAB_0073a5bc;
            if ((p->vMapRefs).pArray[iVar29] != 0) {
              pLVar16 = Lf_ObjCutBest(p,iVar11);
              uVar27 = pLVar16->iFunc;
              if ((int)uVar27 < 0) {
                __assert_fail("pCut->iFunc >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                              ,0x761,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
              }
              uVar19 = *(uint *)&pLVar16->field_0x14;
              if (uVar19 < 0x1000000) {
                if (1 < uVar27) {
                  __assert_fail("Abc_Lit2Var(pCut->iFunc) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                ,0x764,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                }
                if (uVar32 <= uVar34) goto LAB_0073a619;
                local_530[uVar34] = uVar27;
              }
              else {
                if ((uVar19 & 0xff000000) == 0x1000000) {
                  if ((uVar27 & 0x7ffffffe) != 2) {
                    __assert_fail("Abc_Lit2Var(pCut->iFunc) == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                  ,0x76a,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
                  }
                  uVar19 = (uint)pLVar16[1].Sign;
                  if (uVar24 <= uVar19) goto LAB_0073a5bc;
                  if ((int)local_530[uVar19] < 0) goto LAB_0073a638;
                  if (uVar32 <= uVar34) goto LAB_0073a619;
                  local_50c = local_530[uVar19] ^ uVar27 & 1;
                }
                else {
                  uVar23 = p->pPars->nLutSizeMux;
                  if ((uVar23 == 0) || (uVar23 != uVar19 >> 0x18)) {
                    p_02->nSize = 0;
                    uVar27 = *(uint *)&pLVar16->field_0x14;
                    if ((uVar27 >> 0x17 & 1) == 0) {
                      if (0xffffff < uVar27) {
                        uVar33 = 0;
                        do {
                          uVar27 = *(uint *)((long)&pLVar16[1].Sign + uVar33 * 4);
                          if (uVar24 <= uVar27) goto LAB_0073a5bc;
                          Vec_IntPush(p_02,local_530[uVar27]);
                          uVar33 = uVar33 + 1;
                        } while (uVar33 < (byte)pLVar16->field_0x17);
                      }
                    }
                    else {
                      if ((uVar27 & 0xff000000) != 0x3000000) {
                        __assert_fail("pCut->nLeaves == 3",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                      ,0x725,
                                      "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                     );
                      }
                      uVar27 = (uint)pLVar16[1].Sign;
                      if (uVar24 <= uVar27) goto LAB_0073a5bc;
                      if ((int)local_530[uVar27] < 0) goto LAB_0073a638;
                      pGVar3 = pGVar3 + uVar34;
                      Vec_IntPush(p_02,*(uint *)pGVar3 >> 0x1d & 1 ^ local_530[uVar27]);
                      uVar27 = *(uint *)((long)&pLVar16[1].Sign + 4);
                      if (((long)(int)uVar27 < 0) || (uVar24 <= uVar27)) goto LAB_0073a5bc;
                      if ((int)local_530[(int)uVar27] < 0) goto LAB_0073a638;
                      Vec_IntPush(p_02,(uint)((ulong)*(undefined8 *)pGVar3 >> 0x3d) & 1 ^
                                       local_530[(int)uVar27]);
                      uVar27 = pLVar16[1].Delay;
                      if (((long)(int)uVar27 < 0) || (uVar24 <= uVar27)) goto LAB_0073a5bc;
                      pGVar30 = p->pGia;
                      if (pGVar30->pMuxes == (uint *)0x0) {
                        uVar19 = 0;
                      }
                      else {
                        pGVar15 = pGVar30->pObjs;
                        if ((pGVar3 < pGVar15) || (pGVar15 + pGVar30->nObjs <= pGVar3))
                        goto LAB_0073a5fa;
                        uVar19 = pGVar30->pMuxes
                                 [(int)((ulong)((long)pGVar3 - (long)pGVar15) >> 2) * -0x55555555];
                        if ((int)uVar19 < 0) goto LAB_0073a711;
                        uVar19 = uVar19 & 1;
                      }
                      if ((int)local_530[(int)uVar27] < 0) goto LAB_0073a638;
                      Vec_IntPush(p_02,uVar19 ^ local_530[(int)uVar27]);
                    }
                    if (pLVar16->iFunc < 0) {
LAB_0073a5db:
                      __assert_fail("Lit >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                    ,0x12f,"int Abc_Lit2Var(int)");
                    }
                    pVVar5 = p->vTtMem;
                    uVar27 = (uint)pLVar16->iFunc >> 1;
                    if (pVVar5->nEntries <= (int)uVar27) goto LAB_0073a730;
                    local_50c = Kit_TruthToGia(p_03,(uint *)(pVVar5->ppPages
                                                             [uVar27 >> ((byte)pVVar5->LogPageSze &
                                                                        0x1f)] +
                                                            (ulong)(uVar27 & pVVar5->PageMask) *
                                                            (long)pVVar5->nEntrySize),p_02->nSize,
                                               vMemory,p_02,0);
                    if ((int)local_50c < 0) goto LAB_0073a5db;
                    uVar27 = local_50c >> 1;
                    iVar11 = p_01->nSize;
                    Vec_IntFillExtra(p_00,uVar27 + 1,Fill_01);
                    local_4f0 = p_00->nSize;
                    if (local_4f0 <= (int)uVar27) goto LAB_0073a619;
                    p_00->pArray[uVar27] = iVar11;
                    Vec_IntPush(p_01,p_02->nSize);
                    if (0 < p_02->nSize) {
                      lVar35 = 0;
                      do {
                        if (p_02->pArray[lVar35] < 0) goto LAB_0073a5db;
                        Vec_IntPush(p_01,(uint)p_02->pArray[lVar35] >> 1);
                        lVar35 = lVar35 + 1;
                      } while (lVar35 < p_02->nSize);
                    }
                    uVar19 = -uVar27;
                    if ((*(uint *)&pLVar16->field_0x14 >> 0x17 & 1) == 0) {
                      uVar19 = uVar27;
                    }
                    Vec_IntPush(p_01,uVar19);
                  }
                  else {
                    pVVar5 = p->vTtMem;
                    uVar27 = uVar27 >> 1;
                    if (pVVar5->nEntries <= (int)uVar27) {
LAB_0073a730:
                      __assert_fail("i >= 0 && i < p->nEntries",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                    }
                    pwVar21 = pVVar5->ppPages[uVar27 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                              (ulong)(uVar27 & pVVar5->PageMask) * (long)pVVar5->nEntrySize;
                    uVar27 = p->pPars->nLutSize;
                    local_488 = (ulong)uVar27;
                    uVar19 = 1 << ((char)uVar27 - 6U & 0x1f);
                    if ((int)uVar27 < 7) {
                      uVar19 = 1;
                    }
                    uVar27 = Lf_ManFindCofVar(pwVar21,uVar19,uVar23);
                    if (uVar23 <= uVar27) {
                      __assert_fail("iVar >= 0 && iVar < (int)pCut->nLeaves",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                    ,0x6fc,
                                    "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                   );
                    }
                    iVar11 = uVar27 - 6;
                    uVar23 = 1 << ((byte)iVar11 & 0x1f);
                    local_4a8 = pwVar21 + (int)uVar19;
                    uVar33 = 1;
                    if (1 < (int)uVar23) {
                      uVar33 = (ulong)uVar23;
                    }
                    local_490 = (ulong)(uint)(1 << ((byte)uVar27 & 0x1f));
                    uVar17 = (ulong)uVar27;
                    local_498 = (long)(2 << ((byte)iVar11 & 0x1f)) << 3;
                    local_4b0 = local_438 + (int)uVar23;
                    local_480 = (long)(int)uVar23 << 3;
                    puVar28 = &local_4c4;
                    local_4c0 = CONCAT44(extraout_var,uVar27);
                    local_4b8 = (ulong)uVar19;
                    local_4a0 = pwVar21;
                    bVar9 = true;
                    do {
                      bVar8 = bVar9;
                      uVar27 = *(uint *)&pLVar16->field_0x14 >> 0x18;
                      if (0xffffff < *(uint *)&pLVar16->field_0x14) {
                        lVar35 = (ulong)uVar27 - 1;
                        auVar36._8_4_ = (int)lVar35;
                        auVar36._0_8_ = lVar35;
                        auVar36._12_4_ = (int)((ulong)lVar35 >> 0x20);
                        auVar36 = auVar36 ^ _DAT_00912220;
                        uVar20 = 0;
                        auVar37 = _DAT_00912210;
                        do {
                          auVar38 = auVar37 ^ _DAT_00912220;
                          if ((bool)(~(auVar36._4_4_ < auVar38._4_4_ ||
                                      auVar36._0_4_ < auVar38._0_4_ &&
                                      auVar38._4_4_ == auVar36._4_4_) & 1)) {
                            local_478[uVar20] = (int)uVar20;
                          }
                          if (auVar38._12_4_ <= auVar36._12_4_ &&
                              (auVar38._8_4_ <= auVar36._8_4_ || auVar38._12_4_ != auVar36._12_4_))
                          {
                            local_478[uVar20 + 1] = (int)uVar20 + 1;
                          }
                          uVar20 = uVar20 + 2;
                          lVar35 = auVar37._8_8_;
                          auVar37._0_8_ = auVar37._0_8_ + 2;
                          auVar37._8_8_ = lVar35 + 2;
                        } while ((uVar27 + 1 & 0xfffffffe) != uVar20);
                      }
                      bVar7 = (byte)local_490;
                      if (bVar8) {
                        if (uVar19 == 1) {
                          uVar20 = s_Truths6Neg[uVar17] & *local_4a0;
                          local_438[0] = uVar20 << (bVar7 & 0x3f);
LAB_00739e65:
                          local_438[0] = local_438[0] | uVar20;
                        }
                        else if ((uint)local_4c0 < 6) {
                          if (0 < (int)uVar19) {
                            uVar20 = s_Truths6Neg[uVar17];
                            uVar25 = 0;
                            do {
                              local_438[uVar25] =
                                   (local_4a0[uVar25] & uVar20) << (bVar7 & 0x3f) |
                                   local_4a0[uVar25] & uVar20;
                              uVar25 = uVar25 + 1;
                            } while (local_4b8 != uVar25);
                          }
                        }
                        else if (0 < (int)uVar19) {
                          pwVar21 = local_438;
                          puVar18 = local_4a0;
                          pwVar26 = local_4b0;
                          do {
                            if (iVar11 != 0x1f) {
                              uVar20 = 0;
                              do {
                                uVar25 = puVar18[uVar20];
                                pwVar21[uVar20] = uVar25;
                                pwVar26[uVar20] = uVar25;
                                uVar20 = uVar20 + 1;
                              } while (uVar33 != uVar20);
                            }
                            puVar18 = (ulong *)((long)puVar18 + local_498);
                            pwVar26 = (word *)((long)pwVar26 + local_498);
                            pwVar21 = (word *)((long)pwVar21 + local_498);
                          } while (puVar18 < local_4a8);
                        }
                      }
                      else {
                        if (uVar19 == 1) {
                          uVar20 = s_Truths6[uVar17] & *local_4a0;
                          local_438[0] = uVar20 >> (bVar7 & 0x3f);
                          goto LAB_00739e65;
                        }
                        if ((uint)local_4c0 < 6) {
                          if (0 < (int)uVar19) {
                            uVar20 = s_Truths6[uVar17];
                            uVar25 = 0;
                            do {
                              local_438[uVar25] =
                                   (local_4a0[uVar25] & uVar20) >> (bVar7 & 0x3f) |
                                   local_4a0[uVar25] & uVar20;
                              uVar25 = uVar25 + 1;
                            } while (local_4b8 != uVar25);
                          }
                        }
                        else if (0 < (int)uVar19) {
                          pwVar21 = local_438;
                          puVar18 = local_4a0;
                          do {
                            if (iVar11 != 0x1f) {
                              uVar20 = 0;
                              do {
                                wVar6 = *(word *)((long)puVar18 + uVar20 * 8 + local_480);
                                pwVar21[uVar20] = wVar6;
                                *(word *)((long)pwVar21 + uVar20 * 8 + local_480) = wVar6;
                                uVar20 = uVar20 + 1;
                              } while (uVar33 != uVar20);
                            }
                            puVar18 = (ulong *)((long)puVar18 + local_498);
                            pwVar21 = (word *)((long)pwVar21 + local_498);
                          } while (puVar18 < local_4a8);
                        }
                      }
                      uVar27 = Abc_TtMinBase(local_438,local_478,uVar27,(int)local_488);
                      if ((int)uVar27 < 1) {
                        __assert_fail("nVarsNew > 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                      ,0x706,
                                      "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                                     );
                      }
                      p_02->nSize = 0;
                      uVar20 = 0;
                      do {
                        uVar23 = *(uint *)((long)&pLVar16[1].Sign + (long)local_478[uVar20] * 4);
                        if (uVar24 <= uVar23) goto LAB_0073a5bc;
                        Vec_IntPush(p_02,local_530[uVar23]);
                        uVar20 = uVar20 + 1;
                      } while (uVar27 != uVar20);
                      uVar27 = Kit_TruthToGia(p_03,(uint *)local_438,uVar27,vMemory,p_02,0);
                      *puVar28 = uVar27;
                      if ((int)uVar27 < 0) goto LAB_0073a5db;
                      uVar27 = uVar27 >> 1;
                      iVar29 = p_01->nSize;
                      Vec_IntFillExtra(p_00,uVar27 + 1,Fill);
                      if (p_00->nSize <= (int)uVar27) goto LAB_0073a619;
                      p_00->pArray[uVar27] = iVar29;
                      Vec_IntPush(p_01,p_02->nSize);
                      if (0 < p_02->nSize) {
                        lVar35 = 0;
                        do {
                          if (p_02->pArray[lVar35] < 0) goto LAB_0073a5db;
                          Vec_IntPush(p_01,(uint)p_02->pArray[lVar35] >> 1);
                          lVar35 = lVar35 + 1;
                        } while (lVar35 < p_02->nSize);
                      }
                      Vec_IntPush(p_01,uVar27);
                      puVar28 = &local_4c8;
                      bVar9 = false;
                    } while (bVar8);
                    local_438[0] = 0xcacacacacacacaca;
                    p_02->nSize = 0;
                    Vec_IntPush(p_02,local_4c4);
                    Vec_IntPush(p_02,local_4c8);
                    uVar27 = *(uint *)((long)&pLVar16[1].Sign + uVar17 * 4);
                    if (uVar24 <= uVar27) goto LAB_0073a5bc;
                    Vec_IntPush(p_02,local_530[uVar27]);
                    local_50c = Kit_TruthToGia(p_03,(uint *)local_438,p_02->nSize,vMemory,p_02,0);
                    if ((int)local_50c < 0) goto LAB_0073a5db;
                    uVar27 = local_50c >> 1;
                    iVar11 = p_01->nSize;
                    Vec_IntFillExtra(p_00,uVar27 + 1,Fill_00);
                    local_4f0 = p_00->nSize;
                    if (local_4f0 <= (int)uVar27) goto LAB_0073a619;
                    p_00->pArray[uVar27] = iVar11;
                    Vec_IntPush(p_01,p_02->nSize);
                    if (0 < p_02->nSize) {
                      lVar35 = 0;
                      do {
                        if (p_02->pArray[lVar35] < 0) goto LAB_0073a5db;
                        Vec_IntPush(p_01,(uint)p_02->pArray[lVar35] >> 1);
                        lVar35 = lVar35 + 1;
                      } while (lVar35 < p_02->nSize);
                    }
                    Vec_IntPush(p_01,-uVar27);
                  }
                  if (pLVar16->iFunc < 0) {
LAB_0073a711:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                  ,0x130,"int Abc_LitIsCompl(int)");
                  }
                  if ((int)local_50c < 0) {
LAB_0073a638:
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                  ,0x132,"int Abc_LitNotCond(int, int)");
                  }
                  if (uVar32 <= uVar34) goto LAB_0073a619;
                  local_50c = pLVar16->iFunc & 1U ^ local_50c;
                }
                local_530[uVar34] = local_50c;
              }
            }
          }
          else {
            if (uVar24 <= iVar11 - uVar19) goto LAB_0073a5bc;
            if ((int)local_530[iVar11 - uVar19] < 0) goto LAB_0073a638;
            iVar11 = Gia_ManAppendBuf(p_03,local_530[iVar11 - uVar19] ^ uVar27 >> 0x1d & 1);
            if (uVar32 <= uVar34) goto LAB_0073a619;
            local_530[uVar34] = iVar11;
          }
        }
        else {
          if (uVar24 <= iVar11 - uVar19) goto LAB_0073a5bc;
          if ((int)local_530[iVar11 - uVar19] < 0) goto LAB_0073a638;
          Gia_ManAppendCo(p_03,local_530[iVar11 - uVar19] ^ uVar27 >> 0x1d & 1);
        }
      }
      uVar34 = uVar34 + 1;
      pGVar30 = p->pGia;
    } while ((long)uVar34 < (long)pGVar30->nObjs);
  }
  free(local_530);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
  }
  free(vMemory);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  uVar24 = p_03->nObjs;
  if ((int)uVar24 < local_4f0) {
    p_00->nSize = uVar24;
  }
  else {
    Vec_IntFillExtra(p_00,uVar24,Fill_02);
    uVar24 = p_03->nObjs;
    if (p_00->nSize != uVar24) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                    ,0x77a,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
    }
  }
  if (0 < (int)uVar24) {
    piVar12 = p_00->pArray;
    uVar32 = 0;
    do {
      iVar11 = piVar12[uVar32];
      if (0 < iVar11) {
        piVar12[uVar32] = iVar11 + p_03->nObjs;
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 < uVar24);
  }
  iVar11 = p_01->nSize;
  piVar12 = p_01->pArray;
  if ((long)iVar11 < 1) {
    if (piVar12 == (int *)0x0) goto LAB_0073a575;
  }
  else {
    lVar35 = 0;
    do {
      Vec_IntPush(p_00,piVar12[lVar35]);
      lVar35 = lVar35 + 1;
    } while (iVar11 != lVar35);
  }
  free(piVar12);
LAB_0073a575:
  free(p_01);
  if (p_03->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                  ,0x781,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  p_03->vMapping = p_00;
  Gia_ManSetRegNum(p_03,p->pGia->nRegs);
  return p_03;
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingGia( Lf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2*(int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Lf_Cut_t * pCut;
    int i, iLit; 
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachObj1( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntWriteEntry( vCopies, i, Gia_ManAppendCi(pNew) );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendBuf( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        assert( pCut->iFunc >= 0 );
        if ( pCut->nLeaves == 0 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 0 );
            Vec_IntWriteEntry( vCopies, i, pCut->iFunc );
            continue;
        }
        if ( pCut->nLeaves == 1 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut->pLeaves[0] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
            continue;
        }
        iLit = Lf_ManDerivePart( p, pNew, vMapping, vMapping2, vCopies, pCut, vLeaves, vCover, pObj );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}